

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O2

void convolve_2d_sr_ver_8tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  undefined4 uVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  undefined1 auVar14 [32];
  int16_t *piVar15;
  ulong uVar16;
  int16_t *piVar17;
  int32_t iVar18;
  long lVar19;
  uint8_t *dst_00;
  undefined1 (*pauVar20) [32];
  long stride;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  __m256i alVar53;
  undefined1 auVar54 [32];
  __m256i r [2];
  __m256i ss_256 [8];
  __m256i r_1 [4];
  __m256i coeffs_256 [4];
  __m256i r0 [4];
  __m256i r1 [4];
  undefined1 local_ba0 [32];
  __m256i local_b80;
  undefined1 local_b60 [32];
  __m256i local_b40;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  __m256i local_900;
  undefined1 local_8e0 [32];
  __m256i local_8c0;
  __m256i local_880;
  __m256i local_860;
  __m256i local_840;
  __m256i local_820;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  __m256i local_780;
  __m256i local_760;
  __m256i local_740;
  __m256i local_720;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  __m256i local_680;
  __m256i local_660;
  __m256i local_640;
  __m256i local_620;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  __m256i local_580;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  __m256i local_480;
  __m256i local_460;
  __m256i local_440;
  __m256i local_420;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  __m256i local_380;
  __m256i local_360;
  __m256i local_340;
  __m256i local_320;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  __m256i local_280;
  undefined1 local_260 [32];
  __m256i local_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  __m256i local_1e0;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  longlong local_160 [8];
  longlong local_120 [8];
  longlong local_e0 [8];
  longlong local_a0 [14];
  
  if (w == 2) {
    piVar15 = filter_params_y->filter_ptr;
    uVar16 = (ulong)((uint)filter_params_y->taps * (subpel_y_q4 & 0xfU));
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)im_block;
    auVar27 = vpshufd_avx(auVar22,0x55);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)(im_block + 4);
    auVar50 = vpshufd_avx(auVar24,0x55);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = *(ulong *)(im_block + 8);
    auVar31 = vpshufd_avx(auVar44,0x55);
    uVar2 = *(uint *)(im_block + 0xc);
    auVar32 = vpunpckldq_avx(auVar27,auVar24);
    auVar40 = vpunpckldq_avx(auVar50,auVar44);
    auVar27 = vpinsrd_avx(auVar31,*(undefined4 *)(im_block + 0xc),1);
    auVar50 = vpunpcklwd_avx(auVar22,auVar32);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)(im_block + 4);
    auVar31 = vpunpcklwd_avx(auVar25,auVar40);
    uVar1 = *(undefined4 *)(piVar15 + uVar16);
    auVar23._4_4_ = uVar1;
    auVar23._0_4_ = uVar1;
    auVar23._8_4_ = uVar1;
    auVar23._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar15 + uVar16 + 2);
    auVar26._4_4_ = uVar1;
    auVar26._0_4_ = uVar1;
    auVar26._8_4_ = uVar1;
    auVar26._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar15 + uVar16 + 4);
    auVar30._4_4_ = uVar1;
    auVar30._0_4_ = uVar1;
    auVar30._8_4_ = uVar1;
    auVar30._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar15 + uVar16 + 6);
    auVar39._4_4_ = uVar1;
    auVar39._0_4_ = uVar1;
    auVar39._8_4_ = uVar1;
    auVar39._12_4_ = uVar1;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = *(ulong *)(im_block + 8);
    auVar27 = vpunpcklwd_avx(auVar45,auVar27);
    lVar19 = 0;
    auVar47._8_4_ = 0x400;
    auVar47._0_8_ = 0x40000000400;
    auVar47._12_4_ = 0x400;
    do {
      auVar46 = auVar31;
      auVar31 = vpmaddwd_avx(auVar50,auVar23);
      auVar50 = vpinsrd_avx(ZEXT416(uVar2),*(undefined4 *)(im_block + lVar19 * 2 + 0xe),1);
      auVar32 = vpmaddwd_avx(auVar27,auVar30);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)(im_block + lVar19 * 2 + 0xe);
      auVar40 = vpunpcklwd_avx(auVar50,auVar51);
      auVar50 = vpmaddwd_avx(auVar46,auVar26);
      auVar50 = vpaddd_avx(auVar31,auVar50);
      uVar2 = *(uint *)(im_block + lVar19 * 2 + 0x10);
      auVar50 = vpaddd_avx(auVar50,auVar32);
      auVar50 = vpaddd_avx(auVar50,auVar47);
      auVar31 = vpmaddwd_avx(auVar40,auVar39);
      auVar50 = vpaddd_avx(auVar50,auVar31);
      auVar50 = vpsrad_avx(auVar50,0xb);
      auVar50 = vpackssdw_avx(auVar50,auVar50);
      auVar50 = vpackuswb_avx(auVar50,auVar50);
      vpextrw_avx(auVar50,0);
      vpextrw_avx(auVar50,1);
      lVar19 = lVar19 + 2;
      auVar31 = auVar27;
      auVar27 = auVar40;
      auVar50 = auVar46;
    } while (h != (int)lVar19);
  }
  else {
    piVar15 = filter_params_y->filter_ptr;
    uVar16 = (ulong)((uint)filter_params_y->taps * (subpel_y_q4 & 0xfU));
    uVar1 = *(undefined4 *)(piVar15 + uVar16);
    alVar53[0]._4_4_ = uVar1;
    alVar53[0]._0_4_ = uVar1;
    alVar53[1]._0_4_ = uVar1;
    alVar53[1]._4_4_ = uVar1;
    alVar53[2]._0_4_ = uVar1;
    alVar53[2]._4_4_ = uVar1;
    alVar53[3]._0_4_ = uVar1;
    alVar53[3]._4_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar15 + uVar16 + 2);
    auVar54._4_4_ = uVar1;
    auVar54._0_4_ = uVar1;
    auVar54._8_4_ = uVar1;
    auVar54._12_4_ = uVar1;
    auVar54._16_4_ = uVar1;
    auVar54._20_4_ = uVar1;
    auVar54._24_4_ = uVar1;
    auVar54._28_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar15 + uVar16 + 4);
    local_1a0._4_4_ = uVar1;
    local_1a0._0_4_ = uVar1;
    local_1a0._8_4_ = uVar1;
    local_1a0._12_4_ = uVar1;
    local_1a0._16_4_ = uVar1;
    local_1a0._20_4_ = uVar1;
    local_1a0._24_4_ = uVar1;
    local_1a0._28_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar15 + uVar16 + 6);
    local_180._4_4_ = uVar1;
    local_180._0_4_ = uVar1;
    local_180._8_4_ = uVar1;
    local_180._12_4_ = uVar1;
    local_180._16_4_ = uVar1;
    local_180._20_4_ = uVar1;
    local_180._24_4_ = uVar1;
    local_180._28_4_ = uVar1;
    local_1e0 = alVar53;
    local_1c0 = auVar54;
    if (w == 0x10) {
      auVar49 = *(undefined1 (*) [32])im_block;
      auVar34 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar35 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar41 = *(undefined1 (*) [32])(im_block + 0x30);
      auVar37 = *(undefined1 (*) [32])(im_block + 0x40);
      auVar42 = *(undefined1 (*) [32])(im_block + 0x50);
      auVar43 = *(undefined1 (*) [32])(im_block + 0x60);
      auVar38 = ZEXT3264(auVar43);
      if (subpel_y_q4 == 8) {
        pauVar20 = (undefined1 (*) [32])(im_block + 0x80);
        do {
          auVar14 = auVar37;
          auVar43 = pauVar20[-1];
          auVar49 = vpaddw_avx2(auVar43,auVar49);
          auVar37 = auVar38._0_32_;
          auVar36 = vpaddw_avx2(auVar34,auVar37);
          auVar52 = vpaddw_avx2(auVar35,auVar42);
          auVar3 = vpaddw_avx2(auVar41,auVar14);
          auVar5 = vpunpcklwd_avx2(auVar49,auVar36);
          auVar6 = vpunpcklwd_avx2(auVar52,auVar3);
          auVar4 = vpunpckhwd_avx2(auVar49,auVar36);
          auVar52 = vpunpckhwd_avx2(auVar52,auVar3);
          auVar49 = vpmaddwd_avx2((undefined1  [32])alVar53,auVar5);
          auVar36 = vpmaddwd_avx2(auVar54,auVar6);
          local_480 = (__m256i)vpaddd_avx2(auVar36,auVar49);
          auVar49 = vpmaddwd_avx2((undefined1  [32])alVar53,auVar4);
          auVar36 = vpmaddwd_avx2(auVar54,auVar52);
          local_460 = (__m256i)vpaddd_avx2(auVar36,auVar49);
          auVar36 = vpaddw_avx2(auVar43,auVar35);
          auVar52 = vpaddw_avx2(auVar37,auVar41);
          auVar3 = vpaddw_avx2(auVar14,auVar42);
          auVar49 = *pauVar20;
          auVar34 = vpaddw_avx2(auVar49,auVar34);
          auVar5 = vpunpcklwd_avx2(auVar34,auVar36);
          auVar6 = vpunpcklwd_avx2(auVar52,auVar3);
          auVar4 = vpunpckhwd_avx2(auVar34,auVar36);
          auVar52 = vpunpckhwd_avx2(auVar52,auVar3);
          auVar34 = vpmaddwd_avx2((undefined1  [32])alVar53,auVar5);
          auVar36 = vpmaddwd_avx2(auVar54,auVar6);
          local_440 = (__m256i)vpaddd_avx2(auVar36,auVar34);
          auVar34 = vpmaddwd_avx2((undefined1  [32])alVar53,auVar4);
          auVar36 = vpmaddwd_avx2(auVar54,auVar52);
          local_420 = (__m256i)vpaddd_avx2(auVar36,auVar34);
          xy_y_round_store_16x2_avx2(&local_480,dst,(long)dst_stride);
          auVar38 = ZEXT3264(auVar49);
          dst = dst + dst_stride * 2;
          pauVar20 = pauVar20 + 2;
          h = h + -2;
          auVar34 = auVar41;
          auVar49 = auVar35;
          auVar41 = auVar42;
          auVar42 = auVar43;
          auVar35 = auVar14;
        } while (h != 0);
      }
      else {
        local_680 = (__m256i)vpunpcklwd_avx2(auVar49,auVar34);
        local_660 = (__m256i)vpunpcklwd_avx2(auVar35,auVar41);
        local_640 = (__m256i)vpunpcklwd_avx2(auVar37,auVar42);
        local_600 = vpunpckhwd_avx2(auVar49,auVar34);
        local_5e0 = vpunpckhwd_avx2(auVar35,auVar41);
        local_5c0 = vpunpckhwd_avx2(auVar37,auVar42);
        local_880 = (__m256i)vpunpcklwd_avx2(auVar34,auVar35);
        local_860 = (__m256i)vpunpcklwd_avx2(auVar41,auVar37);
        local_840 = (__m256i)vpunpcklwd_avx2(auVar42,auVar43);
        local_800 = vpunpckhwd_avx2(auVar34,auVar35);
        local_7e0 = vpunpckhwd_avx2(auVar41,auVar37);
        local_7c0 = vpunpckhwd_avx2(auVar42,auVar43);
        pauVar20 = (undefined1 (*) [32])(im_block + 0x80);
        auVar49 = local_7c0;
        alVar10 = local_840;
        alVar53 = local_640;
        auVar34 = local_7e0;
        auVar54 = local_5c0;
        alVar12 = local_660;
        auVar35 = local_5e0;
        alVar13 = local_860;
        do {
          auVar42 = auVar54;
          alVar8 = alVar53;
          alVar7 = alVar10;
          auVar37 = auVar49;
          auVar49 = pauVar20[-1];
          alVar53 = (__m256i)vpunpcklwd_avx2(auVar38._0_32_,auVar49);
          auVar54 = vpunpckhwd_avx2(auVar38._0_32_,auVar49);
          auVar41 = *pauVar20;
          alVar10 = (__m256i)vpunpcklwd_avx2(auVar49,auVar41);
          auVar49 = vpunpckhwd_avx2(auVar49,auVar41);
          local_820 = alVar10;
          local_7a0 = auVar49;
          local_620 = alVar53;
          local_5a0 = auVar54;
          xy_y_convolve_8tap_16_avx2(&local_680,&local_1e0,&local_480);
          xy_y_convolve_8tap_16_avx2(&local_880,&local_1e0,&local_440);
          local_880 = alVar13;
          local_860 = alVar7;
          local_840 = alVar10;
          local_800 = auVar34;
          local_7e0 = auVar37;
          local_7c0 = auVar49;
          local_680 = alVar12;
          local_660 = alVar8;
          local_640 = alVar53;
          local_600 = auVar35;
          local_5e0 = auVar42;
          local_5c0 = auVar54;
          xy_y_round_store_16x2_avx2(&local_480,dst,(long)dst_stride);
          auVar38 = ZEXT3264(auVar41);
          dst = dst + dst_stride * 2;
          pauVar20 = pauVar20 + 2;
          h = h + -2;
          auVar34 = auVar37;
          alVar12 = alVar8;
          auVar35 = auVar42;
          alVar13 = alVar7;
        } while (h != 0);
      }
    }
    else if (w == 8) {
      auVar49 = *(undefined1 (*) [32])im_block;
      auVar34 = *(undefined1 (*) [32])(im_block + 8);
      auVar35 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar41 = *(undefined1 (*) [32])(im_block + 0x18);
      auVar37 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar42 = *(undefined1 (*) [32])(im_block + 0x28);
      if (subpel_y_q4 == 8) {
        pauVar20 = (undefined1 (*) [32])(im_block + 0x38);
        do {
          auVar43 = *(undefined1 (*) [32])(pauVar20[-1] + 0x10);
          auVar36 = *pauVar20;
          auVar49 = vpaddw_avx2(auVar36,auVar49);
          auVar34 = vpaddw_avx2(auVar43,auVar34);
          auVar52 = vpaddw_avx2(auVar35,auVar42);
          auVar3 = vpaddw_avx2(auVar41,auVar37);
          auVar5 = vpunpcklwd_avx2(auVar49,auVar34);
          auVar6 = vpunpcklwd_avx2(auVar52,auVar3);
          auVar4 = vpunpckhwd_avx2(auVar49,auVar34);
          auVar52 = vpunpckhwd_avx2(auVar52,auVar3);
          auVar49 = vpmaddwd_avx2((undefined1  [32])alVar53,auVar5);
          auVar34 = vpmaddwd_avx2(auVar54,auVar6);
          local_880 = (__m256i)vpaddd_avx2(auVar34,auVar49);
          auVar49 = vpmaddwd_avx2((undefined1  [32])alVar53,auVar4);
          auVar34 = vpmaddwd_avx2(auVar54,auVar52);
          local_860 = (__m256i)vpaddd_avx2(auVar34,auVar49);
          xy_y_round_store_8x2_avx2(&local_880,dst,(long)dst_stride);
          dst = dst + dst_stride * 2;
          pauVar20 = pauVar20 + 1;
          h = h + -2;
          auVar34 = auVar41;
          auVar49 = auVar35;
          auVar35 = auVar37;
          auVar37 = auVar43;
          auVar41 = auVar42;
          auVar42 = auVar36;
        } while (h != 0);
      }
      else {
        local_680 = (__m256i)vpunpcklwd_avx2(auVar49,auVar34);
        local_660 = (__m256i)vpunpcklwd_avx2(auVar35,auVar41);
        local_640 = (__m256i)vpunpcklwd_avx2(auVar37,auVar42);
        local_600 = vpunpckhwd_avx2(auVar49,auVar34);
        local_5e0 = vpunpckhwd_avx2(auVar35,auVar41);
        local_5c0 = vpunpckhwd_avx2(auVar37,auVar42);
        pauVar20 = (undefined1 (*) [32])(im_block + 0x38);
        auVar54 = local_5c0;
        auVar49 = local_5e0;
        alVar53 = local_640;
        alVar10 = local_660;
        do {
          alVar12 = alVar53;
          auVar34 = auVar54;
          alVar53 = (__m256i)vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar20[-1] + 0x10),*pauVar20);
          auVar54 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar20[-1] + 0x10),*pauVar20);
          local_620 = alVar53;
          local_5a0 = auVar54;
          xy_y_convolve_8tap_16_avx2(&local_680,&local_1e0,&local_880);
          local_680 = alVar10;
          local_660 = alVar12;
          local_640 = alVar53;
          local_600 = auVar49;
          local_5e0 = auVar34;
          local_5c0 = auVar54;
          xy_y_round_store_8x2_avx2(&local_880,dst,(long)dst_stride);
          dst = dst + dst_stride * 2;
          pauVar20 = pauVar20 + 1;
          h = h + -2;
          auVar49 = auVar34;
          alVar10 = alVar12;
        } while (h != 0);
      }
    }
    else if (w == 4) {
      uVar16 = *(ulong *)(im_block + 0x18);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(im_block + 4);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = *(ulong *)im_block;
      auVar49._0_16_ = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar50;
      auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(ulong *)(im_block + 8);
      auVar41._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar40;
      auVar41._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
      auVar49 = vpunpcklwd_avx2(auVar49,auVar41);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(im_block + 0xc);
      auVar37._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar46;
      auVar37._16_16_ = ZEXT116(1) * auVar31;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)(im_block + 0x10);
      auVar34._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar31;
      auVar34._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar48;
      auVar34 = vpunpcklwd_avx2(auVar37,auVar34);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(im_block + 0x14);
      auVar42._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar48;
      auVar42._16_16_ = ZEXT116(1) * auVar32;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar16;
      auVar35._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar32;
      auVar35._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar27;
      auVar35 = vpunpcklwd_avx2(auVar42,auVar35);
      lVar19 = 0;
      auVar43._8_4_ = 0x400;
      auVar43._0_8_ = 0x40000000400;
      auVar43._12_4_ = 0x400;
      auVar43._16_4_ = 0x400;
      auVar43._20_4_ = 0x400;
      auVar43._24_4_ = 0x400;
      auVar43._28_4_ = 0x400;
      do {
        auVar37 = auVar35;
        auVar49 = vpmaddwd_avx2((undefined1  [32])alVar53,auVar49);
        auVar41 = vpmaddwd_avx2(auVar54,auVar34);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(im_block + lVar19 * 4 + 0x1c);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar16;
        auVar52._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar28;
        auVar52._16_16_ = ZEXT116(1) * auVar33;
        uVar16 = *(ulong *)(im_block + lVar19 * 4 + 0x20);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar16;
        auVar36._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar33;
        auVar36._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar29;
        auVar35 = vpunpcklwd_avx2(auVar52,auVar36);
        auVar49 = vpaddd_avx2(auVar41,auVar49);
        auVar41 = vpmaddwd_avx2(auVar37,local_1a0);
        auVar49 = vpaddd_avx2(auVar41,auVar49);
        auVar49 = vpaddd_avx2(auVar49,auVar43);
        auVar41 = vpmaddwd_avx2(auVar35,local_180);
        auVar49 = vpaddd_avx2(auVar41,auVar49);
        auVar49 = vpsrad_avx2(auVar49,0xb);
        auVar49 = vpackssdw_avx2(auVar49,auVar49);
        auVar49 = vpackuswb_avx2(auVar49,auVar49);
        *(int *)dst = auVar49._0_4_;
        *(int *)(dst + dst_stride) = auVar49._16_4_;
        dst = dst + dst_stride * 2;
        lVar19 = lVar19 + 2;
        auVar49 = auVar34;
        auVar34 = auVar37;
      } while (h != (int)lVar19);
    }
    else {
      stride = (long)w;
      piVar17 = im_block + stride * 8 + 0x10;
      piVar15 = im_block + stride * 7 + 0x10;
      lVar19 = 0;
      do {
        dst_00 = dst + lVar19;
        load_16bit_7rows_avx2(im_block + lVar19,stride,&local_680);
        local_880 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_680,(undefined1  [32])local_660
                                            );
        local_8c0 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_640,(undefined1  [32])local_620
                                            );
        local_b40 = (__m256i)vpunpcklwd_avx2(local_600,local_5e0);
        local_800 = vpunpckhwd_avx2((undefined1  [32])local_680,(undefined1  [32])local_660);
        local_8e0 = vpunpckhwd_avx2((undefined1  [32])local_640,(undefined1  [32])local_620);
        local_b60 = vpunpckhwd_avx2(local_600,local_5e0);
        local_480 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_660,(undefined1  [32])local_640
                                            );
        local_900 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_620,local_600);
        local_b80 = (__m256i)vpunpcklwd_avx2(local_5e0,local_5c0);
        local_400 = vpunpckhwd_avx2((undefined1  [32])local_660,(undefined1  [32])local_640);
        local_920 = vpunpckhwd_avx2((undefined1  [32])local_620,local_600);
        local_ba0 = vpunpckhwd_avx2(local_5e0,local_5c0);
        local_860 = local_8c0;
        local_840 = local_b40;
        local_7e0 = local_8e0;
        local_7c0 = local_b60;
        local_460 = local_900;
        local_440 = local_b80;
        local_3e0 = local_920;
        local_3c0 = local_ba0;
        load_16bit_7rows_avx2(im_block + lVar19 + 0x10,stride,&local_580);
        local_780 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_580,local_560);
        local_760 = (__m256i)vpunpcklwd_avx2(local_540,local_520);
        local_740 = (__m256i)vpunpcklwd_avx2(local_500,local_4e0);
        local_700 = vpunpckhwd_avx2((undefined1  [32])local_580,local_560);
        local_6e0 = vpunpckhwd_avx2(local_540,local_520);
        local_6c0 = vpunpckhwd_avx2(local_500,local_4e0);
        local_380 = (__m256i)vpunpcklwd_avx2(local_560,local_540);
        local_360 = (__m256i)vpunpcklwd_avx2(local_520,local_500);
        local_940._8_8_ = uStack_4b8;
        local_940._0_8_ = local_4c0;
        local_940._16_8_ = uStack_4b0;
        local_940._24_8_ = uStack_4a8;
        local_340 = (__m256i)vpunpcklwd_avx2(local_4e0,local_940);
        local_300 = vpunpckhwd_avx2(local_560,local_540);
        local_2e0 = vpunpckhwd_avx2(local_520,local_500);
        local_2c0 = vpunpckhwd_avx2(local_4e0,local_940);
        lVar21 = 0;
        iVar18 = h;
        alVar53 = local_740;
        alVar10 = local_760;
        auVar54 = local_6e0;
        auVar49 = local_6c0;
        alVar12 = local_360;
        alVar13 = local_340;
        auVar34 = local_2e0;
        local_200 = local_5c0;
        auVar35 = local_2c0;
        do {
          alVar11 = alVar53;
          auVar41 = *(undefined1 (*) [32])((long)piVar15 + lVar21 + -0x20);
          alVar7 = (__m256i)vpunpcklwd_avx2(local_200,auVar41);
          auVar37 = vpunpckhwd_avx2(local_200,auVar41);
          local_200 = *(undefined1 (*) [32])((long)piVar17 + lVar21 + -0x20);
          alVar8 = (__m256i)vpunpcklwd_avx2(auVar41,local_200);
          auVar41 = vpunpckhwd_avx2(auVar41,local_200);
          local_820 = alVar7;
          local_7a0 = auVar37;
          local_420 = alVar8;
          local_3a0 = auVar41;
          local_280 = alVar10;
          local_260 = auVar54;
          local_240 = alVar12;
          local_220 = auVar34;
          xy_y_convolve_8tap_16_avx2(&local_880,&local_1e0,(__m256i *)local_160);
          xy_y_convolve_8tap_16_avx2(&local_480,&local_1e0,(__m256i *)local_120);
          local_880[0] = local_8c0[0];
          local_880[1] = local_8c0[1];
          local_880[2] = local_8c0[2];
          local_880[3] = local_8c0[3];
          local_860[0] = local_b40[0];
          local_860[1] = local_b40[1];
          local_860[2] = local_b40[2];
          local_860[3] = local_b40[3];
          local_800 = local_8e0;
          local_7e0 = local_b60;
          local_480[0] = local_900[0];
          local_480[1] = local_900[1];
          local_480[2] = local_900[2];
          local_480[3] = local_900[3];
          local_460[0] = local_b80[0];
          local_460[1] = local_b80[1];
          local_460[2] = local_b80[2];
          local_460[3] = local_b80[3];
          local_400 = local_920;
          local_3e0 = local_ba0;
          auVar54 = *(undefined1 (*) [32])((long)piVar15 + lVar21);
          alVar53 = (__m256i)vpunpcklwd_avx2(local_940,auVar54);
          auVar34 = vpunpckhwd_avx2(local_940,auVar54);
          local_940 = *(undefined1 (*) [32])((long)piVar17 + lVar21);
          alVar9 = (__m256i)vpunpcklwd_avx2(auVar54,local_940);
          auVar42 = vpunpckhwd_avx2(auVar54,local_940);
          local_840 = alVar7;
          local_7c0 = auVar37;
          local_720 = alVar53;
          local_6a0 = auVar34;
          local_440 = alVar8;
          local_3c0 = auVar41;
          local_320 = alVar9;
          local_2a0 = auVar42;
          xy_y_convolve_8tap_16_avx2(&local_780,&local_1e0,(__m256i *)local_e0);
          xy_y_convolve_8tap_16_avx2(&local_380,&local_1e0,(__m256i *)local_a0);
          local_780[0] = local_280[0];
          local_780[1] = local_280[1];
          local_780[2] = local_280[2];
          local_780[3] = local_280[3];
          local_700 = local_260;
          local_380[0] = local_240[0];
          local_380[1] = local_240[1];
          local_380[2] = local_240[2];
          local_380[3] = local_240[3];
          local_300 = local_220;
          local_760 = alVar11;
          local_740 = alVar53;
          local_6e0 = auVar49;
          local_6c0 = auVar34;
          local_360 = alVar13;
          local_340 = alVar9;
          local_2e0 = auVar35;
          local_2c0 = auVar42;
          xy_y_round_store_32_avx2((__m256i *)local_160,(__m256i *)local_e0,dst_00);
          xy_y_round_store_32_avx2((__m256i *)local_120,(__m256i *)local_a0,dst_00 + dst_stride);
          dst_00 = dst_00 + dst_stride * 2;
          lVar21 = lVar21 + (long)(w * 2) * 2;
          local_920 = local_ba0;
          local_900[0] = local_b80[0];
          local_900[1] = local_b80[1];
          local_900[2] = local_b80[2];
          local_900[3] = local_b80[3];
          local_8e0 = local_b60;
          local_8c0[0] = local_b40[0];
          local_8c0[1] = local_b40[1];
          local_8c0[2] = local_b40[2];
          local_8c0[3] = local_b40[3];
          iVar18 = iVar18 + -2;
          alVar10 = alVar11;
          auVar54 = auVar49;
          auVar49 = auVar34;
          alVar12 = alVar13;
          alVar13 = alVar9;
          auVar34 = auVar35;
          auVar35 = auVar42;
          local_ba0 = auVar41;
          local_b80 = alVar8;
          local_b60 = auVar37;
          local_b40 = alVar7;
        } while (iVar18 != 0);
        local_4c0 = local_940._0_8_;
        uStack_4b8 = local_940._8_8_;
        uStack_4b0 = local_940._16_8_;
        uStack_4a8 = local_940._24_8_;
        lVar19 = lVar19 + 0x20;
        piVar17 = piVar17 + 0x20;
        piVar15 = piVar15 + 0x20;
        local_5c0 = local_200;
      } while (lVar19 < stride);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_8tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y;

  if (w == 2) {
    __m128i coeffs_128[4], s_32[8], ss_128[4];

    prepare_coeffs_8tap_sse2(filter_params_y, subpel_y_q4, coeffs_128);

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)(im + 0 * 2));
    s_32[1] = _mm_cvtsi32_si128(*(int32_t *)(im + 1 * 2));
    s_32[2] = _mm_cvtsi32_si128(*(int32_t *)(im + 2 * 2));
    s_32[3] = _mm_cvtsi32_si128(*(int32_t *)(im + 3 * 2));
    s_32[4] = _mm_cvtsi32_si128(*(int32_t *)(im + 4 * 2));
    s_32[5] = _mm_cvtsi32_si128(*(int32_t *)(im + 5 * 2));
    s_32[6] = _mm_cvtsi32_si128(*(int32_t *)(im + 6 * 2));

    const __m128i src01 = _mm_unpacklo_epi32(s_32[0], s_32[1]);
    const __m128i src12 = _mm_unpacklo_epi32(s_32[1], s_32[2]);
    const __m128i src23 = _mm_unpacklo_epi32(s_32[2], s_32[3]);
    const __m128i src34 = _mm_unpacklo_epi32(s_32[3], s_32[4]);
    const __m128i src45 = _mm_unpacklo_epi32(s_32[4], s_32[5]);
    const __m128i src56 = _mm_unpacklo_epi32(s_32[5], s_32[6]);

    ss_128[0] = _mm_unpacklo_epi16(src01, src12);
    ss_128[1] = _mm_unpacklo_epi16(src23, src34);
    ss_128[2] = _mm_unpacklo_epi16(src45, src56);

    y = h;
    do {
      const __m128i res =
          xy_y_convolve_8tap_2x2_sse2(im, s_32, ss_128, coeffs_128);
      xy_y_round_store_2x2_sse2(res, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i coeffs_256[4];

    prepare_coeffs_8tap_avx2(filter_params_y, subpel_y_q4, coeffs_256);

    if (w == 4) {
      __m128i s_64[8];
      __m256i s_256[8], ss_256[4];

      s_64[0] = _mm_loadl_epi64((__m128i *)(im + 0 * 4));
      s_64[1] = _mm_loadl_epi64((__m128i *)(im + 1 * 4));
      s_64[2] = _mm_loadl_epi64((__m128i *)(im + 2 * 4));
      s_64[3] = _mm_loadl_epi64((__m128i *)(im + 3 * 4));
      s_64[4] = _mm_loadl_epi64((__m128i *)(im + 4 * 4));
      s_64[5] = _mm_loadl_epi64((__m128i *)(im + 5 * 4));
      s_64[6] = _mm_loadl_epi64((__m128i *)(im + 6 * 4));

      // Load lines a and b. Line a to lower 128, line b to upper 128
      s_256[0] = _mm256_setr_m128i(s_64[0], s_64[1]);
      s_256[1] = _mm256_setr_m128i(s_64[1], s_64[2]);
      s_256[2] = _mm256_setr_m128i(s_64[2], s_64[3]);
      s_256[3] = _mm256_setr_m128i(s_64[3], s_64[4]);
      s_256[4] = _mm256_setr_m128i(s_64[4], s_64[5]);
      s_256[5] = _mm256_setr_m128i(s_64[5], s_64[6]);

      ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
      ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
      ss_256[2] = _mm256_unpacklo_epi16(s_256[4], s_256[5]);

      y = h;
      do {
        const __m256i res =
            xy_y_convolve_8tap_4x2_avx2(im, s_64, ss_256, coeffs_256);
        xy_y_round_store_4x2_avx2(res, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 8) {
      __m256i s_256[8], r[2];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 8));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 8));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 8));
      s_256[3] = _mm256_loadu_si256((__m256i *)(im + 3 * 8));
      s_256[4] = _mm256_loadu_si256((__m256i *)(im + 4 * 8));
      s_256[5] = _mm256_loadu_si256((__m256i *)(im + 5 * 8));
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[8];

        convolve_8tap_unpack_avx2(s_256, ss_256);

        do {
          xy_y_convolve_8tap_8x2_avx2(im, ss_256, coeffs_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_8tap_8x2_half_pel_avx2(im, coeffs_256, s_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else if (w == 16) {
      __m256i s_256[8], r[4];

      load_16bit_7rows_avx2(im, 16, s_256);
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[8], tt_256[8];

        convolve_8tap_unpack_avx2(s_256, ss_256);
        convolve_8tap_unpack_avx2(s_256 + 1, tt_256);

        do {
          xy_y_convolve_8tap_16x2_avx2(im, 16, coeffs_256, s_256, ss_256,
                                       tt_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_8tap_16x2_half_pel_avx2(im, 16, coeffs_256, s_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else {
      int32_t x = 0;
      __m256i s_256[2][8], r0[4], r1[4];

      assert(!(w % 32));

      __m256i ss_256[2][8], tt_256[2][8];

      do {
        const int16_t *s = im + x;
        uint8_t *d = dst + x;

        load_16bit_7rows_avx2(s, w, s_256[0]);
        convolve_8tap_unpack_avx2(s_256[0], ss_256[0]);
        convolve_8tap_unpack_avx2(s_256[0] + 1, tt_256[0]);

        load_16bit_7rows_avx2(s + 16, w, s_256[1]);
        convolve_8tap_unpack_avx2(s_256[1], ss_256[1]);
        convolve_8tap_unpack_avx2(s_256[1] + 1, tt_256[1]);

        y = h;
        do {
          xy_y_convolve_8tap_16x2_avx2(s, w, coeffs_256, s_256[0], ss_256[0],
                                       tt_256[0], r0);
          xy_y_convolve_8tap_16x2_avx2(s + 16, w, coeffs_256, s_256[1],
                                       ss_256[1], tt_256[1], r1);
          xy_y_round_store_32_avx2(r0 + 0, r1 + 0, d);
          xy_y_round_store_32_avx2(r0 + 2, r1 + 2, d + dst_stride);

          s += 2 * w;
          d += 2 * dst_stride;
          y -= 2;
        } while (y);

        x += 32;
      } while (x < w);
    }
  }
}